

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

void __thiscall
opts::OptionContainer<float>::OptionContainer
          (OptionContainer<float> *this,char s_,string *l_,float *var_,string *help_,string *type_)

{
  undefined8 in_RCX;
  string *in_RDX;
  undefined8 *in_RDI;
  string *in_R8;
  string *in_R9;
  undefined7 in_stack_000000c8;
  string local_c0 [32];
  string local_a0 [24];
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  char in_stack_ffffffffffffff9f;
  BasicOption *in_stack_ffffffffffffffa0;
  string local_50 [32];
  string *local_30;
  string *local_28;
  undefined8 local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__cxx11::string::string(local_50,in_RDX);
  default_value_abi_cxx11_((float *)CONCAT17(s_,in_stack_000000c8));
  std::__cxx11::string::string(local_a0,local_30);
  std::__cxx11::string::string(local_c0,local_28);
  BasicOption::BasicOption
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  *in_RDI = &PTR__OptionContainer_0031a6c8;
  in_RDI[0x12] = local_20;
  return;
}

Assistant:

OptionContainer(char               s_,
                                    const std::string& l_,
                                    T&                 var_,
                                    const std::string& help_,
                                    const std::string& type_ = Traits<T>::type_string()):
                        BasicOption(s_, l_, default_value(var_), type_, help_),
                        var(&var_)                  {}